

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

int Kit_SopIsCubeFree(Kit_Sop_t *cSop)

{
  uint uVar1;
  Kit_Sop_t *cSop_local;
  
  uVar1 = Kit_SopCommonCube(cSop);
  return (int)(uVar1 == 0);
}

Assistant:

int Kit_SopIsCubeFree( Kit_Sop_t * cSop )
{
    return Kit_SopCommonCube( cSop ) == 0;
}